

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O3

void mwTerm(void)

{
  if (mwInited == 0) {
    mwWrite("internal: mwTerm(): MEMWATCH has not been started!\n");
    return;
  }
  if (mwInited == 1) {
    mwAbort();
    return;
  }
  mwInited = mwInited + -1;
  return;
}

Assistant:

void mwTerm(void)
{
	if (mwInited == 1) {
		mwAbort();
		return;
	}
	if (!mwInited) {
		mwWrite("internal: mwTerm(): MEMWATCH has not been started!\n");
	} else {
		mwInited --;
	}
}